

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O3

void __thiscall
CompletionProvider::run
          (CompletionProvider *this,Id *id,
          optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          *paramsOpt)

{
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar1;
  Ch *__s;
  File *file;
  Point cursorPosition;
  string uri;
  CompletionList local_d8;
  undefined1 local_b8 [16];
  pointer pCStack_a8;
  pointer local_a0;
  char *pcStack_98;
  char *local_90;
  size_t local_88;
  int local_80;
  bool local_7c;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_78;
  string local_40;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"Missing params for autocomplete request",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,__s,(allocator<char> *)local_b8);
  file = FileManager::get(&local_40);
  if (file == (File *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"!!! Null file !!!\n",0x12);
    sendNullResult(id);
    goto LAB_0017fbcb;
  }
  local_d8.isIncomplete = false;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (file->type == Tex) {
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)paramsOpt,"position");
    cursorPosition = getPointFromJSON(pGVar1);
    getLatexCompletionsForFileAndPoint((CompletionList *)local_b8,file,cursorPosition);
    local_78.stack_.stack_ =
         (char *)local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.stack_.ownAllocator_ =
         (CrtAllocator *)
         local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.stack_.allocator_ =
         (CrtAllocator *)
         local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_d8.isIncomplete = (bool)local_b8[0];
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_a0;
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._8_8_;
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_finish = pCStack_a8;
    local_b8._8_8_ = (pointer)0x0;
    pCStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector
              ((vector<CompletionItem,_std::allocator<CompletionItem>_> *)&local_78);
    std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector
              ((vector<CompletionItem,_std::allocator<CompletionItem>_> *)(local_b8 + 8));
    if (local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0017f9cc;
    local_78.stack_.stack_ = (char *)0x0;
    local_78.stack_.stackTop_ = (char *)0x0;
    local_78.stack_.allocator_ = (CrtAllocator *)0x0;
    local_78.stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_78.stack_.stackEnd_ = (char *)0x0;
    local_78.stack_.initialCapacity_ = 0x100;
    local_b8._8_8_ = (pointer)0x0;
    pCStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    pcStack_98 = (char *)0x0;
    local_90 = (char *)0x0;
    local_88 = 0x200;
    local_80 = 0x144;
    local_7c = false;
    local_b8._0_8_ = &local_78;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   *)local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_b8,"jsonrpc",7,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_b8,"2.0",3,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_b8,"id",2,false);
    Id::writeId(id,(StringWriter *)local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_b8,"result",6,false);
    CompletionList::reflect(&local_d8,(StringWriter *)local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_b8,0);
    sendMessage(&local_78);
    free(local_a0);
    operator_delete(pCStack_a8,1);
    free(local_78.stack_.stack_);
    operator_delete(local_78.stack_.ownAllocator_,1);
  }
  else {
LAB_0017f9cc:
    sendNullResult(id);
  }
  std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector(&local_d8.items);
LAB_0017fbcb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CompletionProvider::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "Missing params for autocomplete request");
        return;
    }

    Value &params = *paramsOpt;

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    CompletionList completions;

    switch (file->type) {
        case File::Type::Tex:
            completions = getLatexCompletionsForFileAndPoint(*file, getPointFromJSON(params["position"]));
            break;
        case File::Type::Bib:
            // TODO
        default:
            sendNullResult(id);
            return;
    }

    if (completions.empty()) {
        sendNullResult(id);
    } else {
        INIT_WRITER
        ADD_ID(id);
        writer.Key("result"); completions.reflect(writer);
        SEND_MESSAGE
    }
}